

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerReflection::emit_type_member
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  Stream *pSVar1;
  bool bVar2;
  SPIRType *type_00;
  string *this_00;
  string name;
  allocator local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  type_00 = Compiler::get<spirv_cross::SPIRType>
                      ((Compiler *)this,
                       (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id)
  ;
  simple_json::Stream::begin_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  to_member_name_abi_cxx11_(&local_48,this,type,index);
  pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string((string *)&local_a8,"name",(allocator *)&local_88);
  simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&local_48);
  ::std::__cxx11::string::~string((string *)&local_a8);
  bVar2 = type_is_reference(this,type_00);
  if (bVar2) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
    ::std::__cxx11::to_string(&local_68,(type_00->parent_type).id);
    ::std::operator+(&local_88,"_",&local_68);
    simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&local_88);
  }
  else {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (*(int *)&(type_00->super_IVariant).field_0xc != 0xf) {
      ::std::__cxx11::string::string((string *)&local_a8,"type",(allocator *)&local_68);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_88,this,type_00,0);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&local_88);
      this_00 = &local_88;
      goto LAB_002ec0f3;
    }
    ::std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
    ::std::__cxx11::to_string(&local_68,(type_00->super_IVariant).self.id);
    ::std::operator+(&local_88,"_",&local_68);
    simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&local_88);
  }
  ::std::__cxx11::string::~string((string *)&local_88);
  this_00 = &local_68;
LAB_002ec0f3:
  ::std::__cxx11::string::~string((string *)this_00);
  ::std::__cxx11::string::~string((string *)&local_a8);
  emit_type_member_qualifiers(this,type,index);
  simple_json::Stream::end_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CompilerReflection::emit_type_member(const SPIRType &type, uint32_t index)
{
	auto &membertype = get<SPIRType>(type.member_types[index]);
	json_stream->begin_json_object();
	auto name = to_member_name(type, index);
	// FIXME we'd like to emit the offset of each member, but such offsets are
	// context dependent.  See the comment above regarding structure sizes
	json_stream->emit_json_key_value("name", name);

	if (type_is_reference(membertype))
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(membertype.parent_type));
	}
	else if (membertype.basetype == SPIRType::Struct)
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(membertype.self));
	}
	else
	{
		json_stream->emit_json_key_value("type", type_to_glsl(membertype));
	}
	emit_type_member_qualifiers(type, index);
	json_stream->end_json_object();
}